

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O3

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CType *stm)

{
  char *pcVar1;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  char local_38 [8];
  char local_30 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: type\n",0x12);
  if ((stm->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
      super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
      super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl == (CIdExp *)0x0) {
    CError::CError((CError *)local_48,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_48);
    pcVar1 = local_38;
    local_40._M_p = (pointer)local_48;
  }
  else {
    TypeInfo::TypeInfo((TypeInfo *)local_48,VOID);
    (this->lastCalculatedType).isPrimitive = (bool)local_48[0];
    *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_48._1_3_;
    (this->lastCalculatedType).type = local_48._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->lastCalculatedType).className,(string *)&local_40);
    pcVar1 = local_30;
  }
  if (local_40._M_p != pcVar1) {
    operator_delete(local_40._M_p);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CType &stm ) 
{
	std::cout << "typechecker: type\n";
    if( stm.name ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}